

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lesson.h
# Opt level: O2

void __thiscall Lesson::print(Lesson *this)

{
  pointer pPVar1;
  ostream *poVar2;
  char *pcVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  
  if (this->exist == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"subject: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->subject);
    std::operator<<(poVar2," ");
    poVar2 = std::operator<<((ostream *)&std::cout,"room: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->room);
    std::operator<<(poVar2," ");
    lVar5 = 0;
    for (uVar4 = 0;
        pPVar1 = (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl
                 .super__Vector_impl_data._M_start,
        uVar4 < (ulong)(((long)(this->prep_list).
                               super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pPVar1) / 0xb0);
        uVar4 = uVar4 + 1) {
      Professor::print((Professor *)((long)&pPVar1->prep_id + lVar5),false);
      lVar5 = lVar5 + 0xb0;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"time: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->time);
    pcVar3 = " ";
  }
  else {
    poVar2 = (ostream *)&std::cout;
    pcVar3 = "none ";
  }
  std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<((ostream *)&std::cout,"exist: ");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::operator<<(poVar2," ");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Lesson::print() {
    //std::cout  << "id: " << lesson_id << " ";
    if (exist) {
        std::cout  <<  "subject: "  << subject << " ";
        std::cout  << "room: " << room << " ";
        //std::cout  << "preps: " << professor << " ";

        for(size_t i = 0; i < prep_list.size(); i++) {

            prep_list[i].print();
        }
        std::cout << "time: " << time << " ";
        std::cout << "exist: " << exist << " ";
    }
    else {
        std::cout << "none " ;
        std::cout << "exist: " << exist << " ";
    }
    std::cout<<std::endl;



}